

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

string * __thiscall
llvm::StringRef::upper_abi_cxx11_(string *__return_storage_ptr__,StringRef *this)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  size_type e;
  size_type i;
  allocator<char> local_1a;
  undefined1 local_19;
  StringRef *local_18;
  StringRef *this_local;
  string *Result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (StringRef *)__return_storage_ptr__;
  sVar2 = size(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,sVar2,'\0',&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  e = 0;
  sVar2 = size(this);
  for (; e != sVar2; e = e + 1) {
    cVar1 = toUpper(this->Data[e]);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pcVar3 = cVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringRef::upper() const {
  std::string Result(size(), char());
  for (size_type i = 0, e = size(); i != e; ++i) {
    Result[i] = toUpper(Data[i]);
  }
  return Result;
}